

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::ParseBase62Number
          (RustSymbolParser *this,int *value)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  
  *value = -1;
  iVar1 = this->pos_;
  bVar5 = this->encoding_[iVar1];
  if (bVar5 == 0x5f) {
    this->pos_ = iVar1 + 1;
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    bVar4 = false;
    pbVar3 = (byte *)(this->encoding_ + iVar1);
    while( true ) {
      iVar1 = iVar1 + 1;
      if ((9 < (byte)(bVar5 - 0x30)) && (0x19 < (byte)((bVar5 & 0xdf) + 0xbf))) break;
      this->pos_ = iVar1;
      if (iVar2 < 0x2108421) {
        bVar5 = *pbVar3;
        if ((byte)(bVar5 - 0x30) < 10) {
          iVar6 = bVar5 - 0x30;
        }
        else if ((byte)(bVar5 + 0x9f) < 0x1a) {
          iVar6 = bVar5 - 0x57;
        }
        else {
          iVar6 = (char)bVar5 + -0x1d;
        }
        iVar2 = iVar2 * 0x3e + iVar6;
      }
      else {
        bVar4 = true;
      }
      bVar5 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    }
    if (bVar5 != 0x5f) {
      return false;
    }
    this->pos_ = iVar1;
    if (bVar4) {
      return true;
    }
    iVar2 = iVar2 + 1;
  }
  *value = iVar2;
  return true;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseBase62Number(int& value) {
    value = -1;

    // base-62-number = (digit | lower | upper)* _
    //
    // An empty base-62 digit sequence means 0.
    if (Eat('_')) {
      value = 0;
      return true;
    }

    // A nonempty digit sequence denotes its base-62 value plus 1.
    int encoded_number = 0;
    bool overflowed = false;
    while (IsAlpha(Peek()) || IsDigit(Peek())) {
      const char c = Take();
      if (encoded_number >= std::numeric_limits<int>::max()/62) {
        // If we are close to overflowing an int, keep parsing but stop updating
        // encoded_number and remember to return -1 at the end.  The point is to
        // avoid undefined behavior while parsing crate-root disambiguators,
        // which are large in practice but not shown in demangling, while
        // successfully computing closure and shim disambiguators, which are
        // typically small and are printed out.
        overflowed = true;
      } else {
        int digit;
        if (IsDigit(c)) {
          digit = c - '0';
        } else if (IsLower(c)) {
          digit = c - 'a' + 10;
        } else {
          digit = c - 'A' + 36;
        }
        encoded_number = 62 * encoded_number + digit;
      }
    }

    if (!Eat('_')) return false;
    if (!overflowed) value = encoded_number + 1;
    return true;
  }